

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O1

void __thiscall
MyACESPictureDescriptor::FillDescriptor(MyACESPictureDescriptor *this,MXFReader *Reader)

{
  size_t *psVar1;
  long *plVar2;
  MDD_t MVar3;
  byte_t *pbVar4;
  RGBAEssenceDescriptor *pRVar5;
  long *plVar6;
  undefined8 uVar7;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  ILogSink *pIVar10;
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  object_list;
  char buf [64];
  long *local_1c8;
  undefined1 *local_1c0;
  undefined8 local_1b8;
  MXFReader *local_1b0;
  UL local_1a8 [2];
  Result_t local_168 [104];
  Result_t local_100 [104];
  Result_t local_98 [104];
  
  MVar3 = ASDCP::DefaultCompositeDict();
  pbVar4 = (byte_t *)ASDCP::Dictionary::Type(MVar3);
  local_1a8[0].super_Identifier<16U>.m_HasValue = true;
  local_1a8[0].super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pbVar4;
  local_1a8[0].super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pbVar4 + 8);
  local_1a8[0].super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00113ae8;
  pRVar5 = get_descriptor_by_type<AS_02::ACES::MXFReader,ASDCP::MXF::RGBAEssenceDescriptor>
                     (Reader,local_1a8);
  this->m_RGBADescriptor = pRVar5;
  if (pRVar5 == (RGBAEssenceDescriptor *)0x0) {
    pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar10,"Picture descriptor not found.\n");
  }
  else {
    (this->super_PictureDescriptor).SampleRate = *(Rational *)(pRVar5 + 0xf0);
    if (pRVar5[0x100] == (RGBAEssenceDescriptor)0x1) {
      (this->super_PictureDescriptor).ContainerDuration = *(ui32_t *)(pRVar5 + 0xf8);
    }
  }
  local_1b8 = 0;
  local_1c8 = (long *)&local_1c8;
  local_1c0 = (undefined1 *)&local_1c8;
  local_1b0 = Reader;
  plVar6 = (long *)(**(code **)(*(long *)Reader + 0x10))(Reader);
  MVar3 = ASDCP::DefaultCompositeDict();
  uVar7 = ASDCP::Dictionary::Type(MVar3);
  (**(code **)(*plVar6 + 0xb0))(local_98,plVar6,uVar7,&local_1c8);
  Kumu::Result_t::~Result_t(local_98);
  plVar6 = local_1c8;
  if ((long **)local_1c8 != &local_1c8) {
    do {
      if (plVar6[2] == 0) {
        p_Var8 = (_List_node_base *)0x0;
      }
      else {
        p_Var8 = (_List_node_base *)
                 __dynamic_cast(plVar6[2],&ASDCP::MXF::InterchangeObject::typeinfo,
                                &ASDCP::MXF::ACESPictureSubDescriptor::typeinfo,0);
      }
      if (p_Var8 == (_List_node_base *)0x0) {
        pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
        uVar7 = Kumu::bin2UUIDhex((uchar *)(plVar6[2] + 0x61),0x10,(char *)local_1a8,0x40);
        Kumu::ILogSink::Error(pIVar10,"ACESPictureSubDescriptor type error.\n",uVar7);
      }
      else {
        p_Var9 = (_List_node_base *)operator_new(0x18);
        p_Var9[1]._M_next = p_Var8;
        std::__detail::_List_node_base::_M_hook(p_Var9);
        psVar1 = &(this->m_ACESPictureSubDescriptorList).
                  super__List_base<ASDCP::MXF::ACESPictureSubDescriptor_*,_std::allocator<ASDCP::MXF::ACESPictureSubDescriptor_*>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
      }
      plVar6 = (long *)*plVar6;
    } while ((long **)plVar6 != &local_1c8);
  }
  plVar6 = local_1c8;
  if ((long **)local_1c8 != &local_1c8) {
    do {
      plVar2 = (long *)*plVar6;
      operator_delete(plVar6,0x18);
      plVar6 = plVar2;
    } while ((long **)plVar2 != &local_1c8);
  }
  local_1b8 = 0;
  local_1c8 = (long *)&local_1c8;
  local_1c0 = (undefined1 *)&local_1c8;
  plVar6 = (long *)(**(code **)(*(long *)local_1b0 + 0x10))();
  MVar3 = ASDCP::DefaultCompositeDict();
  uVar7 = ASDCP::Dictionary::Type(MVar3);
  (**(code **)(*plVar6 + 0xb0))(local_100,plVar6,uVar7,&local_1c8);
  Kumu::Result_t::~Result_t(local_100);
  plVar6 = local_1c8;
  if ((long **)local_1c8 != &local_1c8) {
    do {
      if (plVar6[2] == 0) {
        p_Var8 = (_List_node_base *)0x0;
      }
      else {
        p_Var8 = (_List_node_base *)
                 __dynamic_cast(plVar6[2],&ASDCP::MXF::InterchangeObject::typeinfo,
                                &ASDCP::MXF::TargetFrameSubDescriptor::typeinfo,0);
      }
      if (p_Var8 == (_List_node_base *)0x0) {
        pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
        uVar7 = Kumu::bin2UUIDhex((uchar *)(plVar6[2] + 0x61),0x10,(char *)local_1a8,0x40);
        Kumu::ILogSink::Error(pIVar10,"TargetFrameSubDescriptor type error.\n",uVar7);
      }
      else {
        p_Var9 = (_List_node_base *)operator_new(0x18);
        p_Var9[1]._M_next = p_Var8;
        std::__detail::_List_node_base::_M_hook(p_Var9);
        psVar1 = &(this->m_TargetFrameSubDescriptorList).
                  super__List_base<ASDCP::MXF::TargetFrameSubDescriptor_*,_std::allocator<ASDCP::MXF::TargetFrameSubDescriptor_*>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
      }
      plVar6 = (long *)*plVar6;
    } while ((long **)plVar6 != &local_1c8);
  }
  plVar6 = local_1c8;
  if ((long **)local_1c8 != &local_1c8) {
    do {
      plVar2 = (long *)*plVar6;
      operator_delete(plVar6,0x18);
      plVar6 = plVar2;
    } while ((long **)plVar2 != &local_1c8);
  }
  local_1b8 = 0;
  local_1c8 = (long *)&local_1c8;
  local_1c0 = (undefined1 *)&local_1c8;
  plVar6 = (long *)(**(code **)(*(long *)local_1b0 + 0x10))();
  MVar3 = ASDCP::DefaultCompositeDict();
  uVar7 = ASDCP::Dictionary::Type(MVar3);
  (**(code **)(*plVar6 + 0xb0))(local_168,plVar6,uVar7,&local_1c8);
  Kumu::Result_t::~Result_t(local_168);
  if ((long **)local_1c8 == &local_1c8) {
    pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar10,"MXF Metadata contains no Track Sets.\n");
  }
  (this->super_PictureDescriptor).EditRate = *(Rational *)(local_1c8[2] + 0x108);
  plVar6 = local_1c8;
  if ((long **)local_1c8 != &local_1c8) {
    do {
      plVar2 = (long *)*plVar6;
      operator_delete(plVar6,0x18);
      plVar6 = plVar2;
    } while ((long **)plVar2 != &local_1c8);
  }
  return;
}

Assistant:

void FillDescriptor(AS_02::ACES::MXFReader& Reader)
  {
    m_RGBADescriptor = get_descriptor_by_type<AS_02::ACES::MXFReader, RGBAEssenceDescriptor>
      (Reader, DefaultCompositeDict().ul(MDD_RGBAEssenceDescriptor));

    if ( m_RGBADescriptor != 0 )
      {
    	SampleRate = m_RGBADescriptor->SampleRate;
        if ( ! m_RGBADescriptor->ContainerDuration.empty() )
          {
            ContainerDuration = m_RGBADescriptor->ContainerDuration;
          }
      }
    else
      {
	DefaultLogSink().Error("Picture descriptor not found.\n");
      }

    std::list<InterchangeObject*> object_list;
    Reader.OP1aHeader().GetMDObjectsByType(DefaultCompositeDict().ul(MDD_ACESPictureSubDescriptor), object_list);

    std::list<InterchangeObject*>::iterator i = object_list.begin();
    for ( ; i != object_list.end(); ++i )
      {
    	ACESPictureSubDescriptor *p = dynamic_cast<ACESPictureSubDescriptor*>(*i);

	if ( p )
	  {
		m_ACESPictureSubDescriptorList.push_back(p);
	  }
	else
	  {
	    char buf[64];
	    DefaultLogSink().Error("ACESPictureSubDescriptor type error.\n", (**i).InstanceUID.EncodeHex(buf, 64));
	  }
      }

    object_list.clear();

    Reader.OP1aHeader().GetMDObjectsByType(DefaultCompositeDict().ul(MDD_TargetFrameSubDescriptor), object_list);

    i = object_list.begin();
    for ( ; i != object_list.end(); ++i )
      {
    	TargetFrameSubDescriptor *p = dynamic_cast<TargetFrameSubDescriptor*>(*i);

	if ( p )
	  {
		m_TargetFrameSubDescriptorList.push_back(p);
	  }
	else
	  {
	    char buf[64];
	    DefaultLogSink().Error("TargetFrameSubDescriptor type error.\n", (**i).InstanceUID.EncodeHex(buf, 64));
	  }
      }

    object_list.clear();

    Reader.OP1aHeader().GetMDObjectsByType(DefaultCompositeDict().ul(MDD_Track), object_list);

    if ( object_list.empty() )
      {
	DefaultLogSink().Error("MXF Metadata contains no Track Sets.\n");
      }

    EditRate = ((Track*)object_list.front())->EditRate;
  }